

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtrack.cc
# Opt level: O0

bool __thiscall re2::Backtracker::Try(Backtracker *this,int id,char *p)

{
  byte *pbVar1;
  bool bVar2;
  InstOp IVar3;
  EmptyOp EVar4;
  EmptyOp EVar5;
  int iVar6;
  iterator pcVar7;
  ostream *poVar8;
  byte *pbVar9;
  char *pcVar10;
  int local_1d8;
  int i;
  bool ret;
  char *q;
  LogMessage local_1b8;
  Inst *local_38;
  Inst *ip;
  byte *pbStack_28;
  int c;
  char *p_local;
  Backtracker *pBStack_18;
  int id_local;
  Backtracker *this_local;
  
  ip._4_4_ = 0xffffffff;
  pbStack_28 = (byte *)p;
  p_local._4_4_ = id;
  pBStack_18 = this;
  pcVar7 = StringPiece::end(&this->text_);
  if (p < pcVar7) {
    ip._4_4_ = (uint)*pbStack_28;
  }
  local_38 = Prog::inst(this->prog_,p_local._4_4_);
  IVar3 = Prog::Inst::opcode(local_38);
  pbVar1 = pbStack_28;
  switch(IVar3) {
  case kInstAltMatch:
    this_local._7_1_ = false;
    break;
  case kInstByteRange:
    bVar2 = Prog::Inst::Matches(local_38,ip._4_4_);
    if (bVar2) {
      iVar6 = Prog::Inst::out(local_38);
      this_local._7_1_ = Visit(this,iVar6,(char *)(pbStack_28 + 1));
    }
    else {
      this_local._7_1_ = false;
    }
    break;
  case kInstCapture:
    iVar6 = Prog::Inst::cap(local_38);
    if ((iVar6 < 0) || (iVar6 = Prog::Inst::cap(local_38), 0x3f < iVar6)) {
      iVar6 = Prog::Inst::out(local_38);
      this_local._7_1_ = Visit(this,iVar6,(char *)pbStack_28);
    }
    else {
      iVar6 = Prog::Inst::cap(local_38);
      pbVar1 = pbStack_28;
      pcVar10 = this->cap_[iVar6];
      iVar6 = Prog::Inst::cap(local_38);
      this->cap_[iVar6] = (char *)pbVar1;
      iVar6 = Prog::Inst::out(local_38);
      bVar2 = Visit(this,iVar6,(char *)pbStack_28);
      iVar6 = Prog::Inst::cap(local_38);
      this->cap_[iVar6] = pcVar10;
      this_local._7_1_ = bVar2;
    }
    break;
  case kInstEmptyWidth:
    EVar4 = Prog::Inst::empty(local_38);
    EVar5 = Prog::EmptyFlags(&this->context_,(char *)pbStack_28);
    if ((EVar4 & (EVar5 ^ 0xffffffff)) == 0) {
      iVar6 = Prog::Inst::out(local_38);
      this_local._7_1_ = Visit(this,iVar6,(char *)pbStack_28);
    }
    else {
      this_local._7_1_ = false;
    }
    break;
  case kInstMatch:
    if (((this->endmatch_ & 1U) == 0) ||
       (pbVar9 = (byte *)StringPiece::end(&this->context_), pbVar1 == pbVar9)) {
      this->cap_[1] = (char *)pbStack_28;
      pcVar10 = StringPiece::data(this->submatch_);
      pbVar1 = pbStack_28;
      if ((pcVar10 == (char *)0x0) ||
         (((this->longest_ & 1U) != 0 &&
          (pbVar9 = (byte *)StringPiece::end(this->submatch_), pbVar9 < pbVar1)))) {
        for (local_1d8 = 0; local_1d8 < this->nsubmatch_; local_1d8 = local_1d8 + 1) {
          StringPiece::set(this->submatch_ + local_1d8,this->cap_[local_1d8 << 1],
                           (int)this->cap_[local_1d8 * 2 + 1] - (int)this->cap_[local_1d8 << 1]);
        }
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
    break;
  case kInstNop:
    iVar6 = Prog::Inst::out(local_38);
    this_local._7_1_ = Visit(this,iVar6,(char *)pbStack_28);
    break;
  case kInstFail:
    this_local._7_1_ = false;
    break;
  default:
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/backtrack.cc"
               ,0xba);
    poVar8 = LogMessage::stream(&local_1b8);
    poVar8 = std::operator<<(poVar8,"Unexpected opcode: ");
    IVar3 = Prog::Inst::opcode(local_38);
    std::ostream::operator<<(poVar8,IVar3);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b8);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Backtracker::Try(int id, const char* p) {
  // Pick out byte at current position.  If at end of string,
  // have to explore in hope of finishing a match.  Use impossible byte -1.
  int c = -1;
  if (p < text_.end())
    c = *p & 0xFF;

  Prog::Inst* ip = prog_->inst(id);
  switch (ip->opcode()) {
    default:
      LOG(FATAL) << "Unexpected opcode: " << (int)ip->opcode();
      return false;  // not reached

    case kInstAltMatch:
      // Ignored.
      return false;

    case kInstByteRange:
      if (ip->Matches(c))
        return Visit(ip->out(), p+1);
      return false;

    case kInstCapture:
      if (0 <= ip->cap() && ip->cap() < arraysize(cap_)) {
        // Capture p to register, but save old value.
        const char* q = cap_[ip->cap()];
        cap_[ip->cap()] = p;
        bool ret = Visit(ip->out(), p);
        // Restore old value as we backtrack.
        cap_[ip->cap()] = q;
        return ret;
      }
      return Visit(ip->out(), p);

    case kInstEmptyWidth:
      if (ip->empty() & ~Prog::EmptyFlags(context_, p))
        return false;
      return Visit(ip->out(), p);

    case kInstNop:
      return Visit(ip->out(), p);

    case kInstMatch:
      // We found a match.  If it's the best so far, record the
      // parameters in the caller's submatch_ array.
      if (endmatch_ && p != context_.end())
        return false;
      cap_[1] = p;
      if (submatch_[0].data() == NULL ||           // First match so far ...
          (longest_ && p > submatch_[0].end())) {  // ... or better match
        for (int i = 0; i < nsubmatch_; i++)
          submatch_[i].set(cap_[2*i],
                           static_cast<int>(cap_[2*i+1] - cap_[2*i]));
      }
      return true;

    case kInstFail:
      return false;
  }
}